

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

void Strings::copyAndZero(void *dest,int destSize,void *src,int srcSize)

{
  int iVar1;
  
  if (destSize != 0 && dest != (void *)0x0) {
    *(undefined1 *)((long)dest + (long)destSize + -1) = 0;
    if (src != (void *)0x0) {
      iVar1 = destSize + -1;
      if (srcSize <= destSize + -1) {
        iVar1 = srcSize;
      }
      memcpy(dest,src,(long)iVar1);
    }
    if (destSize - srcSize != 0 && srcSize <= destSize) {
      memset((void *)((long)dest + (long)srcSize),0,(long)(destSize - srcSize));
      return;
    }
  }
  return;
}

Assistant:

void copyAndZero(void * dest, int destSize, const void * src, int srcSize)
    {
        if (!dest || !destSize) return;
        ((char*)dest)[destSize - 1] = 0;
        if (src != 0)
            memcpy(dest, src, min(destSize - 1, srcSize));

        if (srcSize < destSize)
            memset((char*)dest + srcSize, 0, destSize - srcSize);
    }